

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O1

bool __thiscall
Fossilize::StateReplayer::Impl::parse_attachment
          (Impl *this,Value *value,VkAttachmentReference **out_reference)

{
  VkAttachmentReference *ref;
  
  ref = (VkAttachmentReference *)ScratchAllocator::allocate_raw(&this->allocator,8,0x10);
  if (ref != (VkAttachmentReference *)0x0) {
    ref->attachment = 0;
    ref->layout = VK_IMAGE_LAYOUT_UNDEFINED;
  }
  parse_attachment_base<VkAttachmentReference>(ref,value);
  *out_reference = ref;
  return true;
}

Assistant:

bool StateReplayer::Impl::parse_attachment(const Value &value, const VkAttachmentReference **out_reference)
{
	auto *ret = allocator.allocate_cleared<VkAttachmentReference>();
	parse_attachment_base(*ret, value);
	*out_reference = ret;
	return true;
}